

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void input_dialog_abort_proc(Am_Object *cmd)

{
  Am_Value *value;
  Am_Object widget_cmd;
  Am_Object widget;
  Am_Object_Method aborter;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object text_widget;
  
  Am_Object::Get_Owner((Am_Object *)&aborter,(Am_Slot_Flags)cmd);
  Am_Object::Get_Object(&widget,(Am_Slot_Key)&aborter,0x68);
  Am_Object::~Am_Object((Am_Object *)&aborter);
  Am_Object::Get_Object((Am_Object *)&aborter,(Am_Slot_Key)&widget,0x1ec);
  Am_Object::Get_Object(&text_widget,(Am_Slot_Key)&aborter,0x1eb);
  Am_Object::~Am_Object((Am_Object *)&aborter);
  Am_Object::Am_Object(&local_18,&text_widget);
  Am_Abort_Widget(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Object(&widget_cmd,(Am_Slot_Key)&widget,0xc5);
  value = Am_Object::Get(&widget_cmd,0xc9,0);
  Am_Object_Method::Am_Object_Method(&aborter,value);
  Am_Object::Am_Object(&local_20,&widget_cmd);
  (*aborter.Call)((Am_Object_Data *)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&widget_cmd);
  Am_Object::~Am_Object(&text_widget);
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, input_dialog_abort, (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner().Get_Object(Am_WINDOW);
  Am_Object text_widget =
      widget.Get_Object(Am_DIALOG_GROUP).Get_Object(Am_TEXT_WIDGET);
  Am_Abort_Widget(text_widget);
  // explicitly call dialog box's abort method.  We don't have any
  // implementation parent here, because then this stop method would call
  // the dialog's stop method as well as the abort method.
  // Is there a better way?
  Am_Object widget_cmd = widget.Get_Object(Am_COMMAND);
  Am_Object_Method aborter = widget_cmd.Get(Am_ABORT_DO_METHOD);
  aborter.Call(widget_cmd);
}